

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joiner_session.cpp
# Opt level: O1

void __thiscall
ot::commissioner::JoinerSession::JoinerSession
          (JoinerSession *this,CommissionerImpl *aCommImpl,ByteArray *aJoinerId,string *aJoinerPSkd,
          uint16_t aJoinerUdpPort,uint16_t aJoinerRouterLocator,Address *aJoinerAddr,
          uint16_t aJoinerPort,Address *aLocalAddr,uint16_t aLocalPort)

{
  pointer pcVar1;
  undefined4 uVar2;
  bool local_9a;
  undefined1 local_99;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  string *local_90;
  ByteArray *local_88;
  undefined1 local_80 [24];
  char local_68 [16];
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  (this->super_enable_shared_from_this<ot::commissioner::JoinerSession>)._M_weak_this.
  super___weak_ptr<ot::commissioner::JoinerSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<ot::commissioner::JoinerSession>)._M_weak_this.
  super___weak_ptr<ot::commissioner::JoinerSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->mCommImpl = aCommImpl;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->mJoinerId,aJoinerId);
  local_90 = &this->mJoinerPSKd;
  local_98 = &(this->mJoinerPSKd).field_2;
  (this->mJoinerPSKd)._M_dataplus._M_p = (pointer)local_98;
  pcVar1 = (aJoinerPSkd->_M_dataplus)._M_p;
  local_88 = &this->mJoinerId;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pcVar1,pcVar1 + aJoinerPSkd->_M_string_length);
  this->mJoinerUdpPort = aJoinerUdpPort;
  this->mJoinerRouterLocator = aJoinerRouterLocator;
  (this->mRelaySocket).
  super___shared_ptr<ot::commissioner::JoinerSession::RelaySocket,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ot::commissioner::JoinerSession::RelaySocket,std::allocator<ot::commissioner::JoinerSession::RelaySocket>,ot::commissioner::JoinerSession&,ot::commissioner::Address_const&,unsigned_short&,ot::commissioner::Address_const&,unsigned_short&>
            (&(this->mRelaySocket).
              super___shared_ptr<ot::commissioner::JoinerSession::RelaySocket,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(RelaySocket **)&this->mRelaySocket,
             (allocator<ot::commissioner::JoinerSession::RelaySocket> *)local_80,this,aJoinerAddr,
             &aJoinerPort,aLocalAddr,&aLocalPort);
  local_80._0_8_ = aCommImpl->mEventBase;
  local_9a = true;
  (this->mDtlsSession).super___shared_ptr<ot::commissioner::DtlsSession,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ot::commissioner::DtlsSession,std::allocator<ot::commissioner::DtlsSession>,event_base*,bool,std::shared_ptr<ot::commissioner::JoinerSession::RelaySocket>&>
            (&(this->mDtlsSession).
              super___shared_ptr<ot::commissioner::DtlsSession,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(DtlsSession **)&this->mDtlsSession,
             (allocator<ot::commissioner::DtlsSession> *)&local_99,(event_base **)local_80,&local_9a
             ,&this->mRelaySocket);
  coap::Coap::Coap(&this->mCoap,aCommImpl->mEventBase,
                   &((this->mDtlsSession).
                     super___shared_ptr<ot::commissioner::DtlsSession,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_Endpoint);
  local_80._0_8_ = (event_base *)(local_80 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"/c/jf","");
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<void_(const_ot::commissioner::coap::Message_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/joiner_session.cpp:83:39)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_ot::commissioner::coap::Message_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/joiner_session.cpp:83:39)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  coap::Resource::Resource(&this->mResourceJoinFin,(string *)local_80,(RequestHandler *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  if ((event_base *)local_80._0_8_ != (event_base *)(local_80 + 0x10)) {
    operator_delete((void *)local_80._0_8_);
  }
  (this->mExpirationTime).__d.__r = 0;
  coap::Coap::AddResource((Error *)local_80,&this->mCoap,&this->mResourceJoinFin);
  uVar2 = local_80._0_4_;
  if ((char *)local_80._8_8_ != local_68) {
    operator_delete((void *)local_80._8_8_);
  }
  if (uVar2 == kNone) {
    return;
  }
  abort();
}

Assistant:

JoinerSession::JoinerSession(CommissionerImpl  &aCommImpl,
                             const ByteArray   &aJoinerId,
                             const std::string &aJoinerPSkd,
                             uint16_t           aJoinerUdpPort,
                             uint16_t           aJoinerRouterLocator,
                             const Address     &aJoinerAddr,
                             uint16_t           aJoinerPort,
                             const Address     &aLocalAddr,
                             uint16_t           aLocalPort)
    : mCommImpl(aCommImpl)
    , mJoinerId(aJoinerId)
    , mJoinerPSKd(aJoinerPSkd)
    , mJoinerUdpPort(aJoinerUdpPort)
    , mJoinerRouterLocator(aJoinerRouterLocator)
    , mRelaySocket(std::make_shared<RelaySocket>(*this, aJoinerAddr, aJoinerPort, aLocalAddr, aLocalPort))
    , mDtlsSession(std::make_shared<DtlsSession>(aCommImpl.GetEventBase(), /* aIsServer */ true, mRelaySocket))
    , mCoap(aCommImpl.GetEventBase(), *mDtlsSession)
    , mResourceJoinFin(uri::kJoinFin, [this](const coap::Request &aRequest) { HandleJoinFin(aRequest); })
{
    SuccessOrDie(mCoap.AddResource(mResourceJoinFin));
}